

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestSubmitCommand::InitializeHandler(cmCTestSubmitCommand *this)

{
  const_iterator __position;
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  pointer pbVar4;
  bool bVar5;
  cmValue cVar6;
  ostream *poVar7;
  cmCTestSubmitHandler *this_00;
  char *pcVar8;
  pointer name;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tlsVersionEnv;
  ostringstream cmCTestLog_msg;
  undefined1 local_200 [32];
  bool local_1e0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Base_ptr local_1b8;
  size_t local_1b0;
  ios_base local_168 [272];
  cmCTestSubmitHandler *local_58;
  Part local_50;
  undefined4 uStack_4c;
  long local_40 [2];
  
  if ((this->SubmitURL)._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_SUBMIT_URL","");
    cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (cVar6.Value == (string *)0x0) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_DROP_METHOD","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropMethod",(string *)local_1d8,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_DROP_SITE_USER","")
      ;
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropSiteUser",(string *)local_1d8,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"CTEST_DROP_SITE_PASSWORD","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropSitePassword",(string *)local_1d8,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_DROP_SITE","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropSite",(string *)local_1d8,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_DROP_LOCATION","");
      cmCTest::SetCTestConfigurationFromCMakeVariable
                (pcVar2,pcVar1,"DropLocation",(string *)local_1d8,
                 (this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      goto LAB_0022965d;
    }
  }
  else {
    cVar6.Value = &this->SubmitURL;
  }
  cmCTest::SetCTestConfiguration
            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"SubmitURL",cVar6.Value,
             (this->super_cmCTestHandlerCommand).Quiet);
LAB_0022965d:
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_TLS_VERSION","");
  bVar5 = cmCTest::SetCTestConfigurationFromCMakeVariable
                    (pcVar2,pcVar1,"TLSVersion",(string *)local_1d8,
                     (this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CMAKE_TLS_VERSION","");
    cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (cVar6.Value == (string *)0x0) {
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CMAKE_TLS_VERSION","");
      cmSystemTools::GetEnvVar
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_200,(string *)local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      if (local_1e0 == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,
                   "SetCTestConfiguration from ENV{CMAKE_TLS_VERSION}:TLSVersion:",0x3d);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d8,(char *)local_200._0_8_,local_200._8_8_);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx"
                     ,0x4b,(char *)CONCAT44(uStack_4c,local_50),
                     (this->super_cmCTestHandlerCommand).Quiet);
        if ((long *)CONCAT44(uStack_4c,local_50) != local_40) {
          operator_delete((long *)CONCAT44(uStack_4c,local_50),local_40[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"TLSVersion",
                   (string *)local_200,(this->super_cmCTestHandlerCommand).Quiet);
      }
      if (((local_1e0 & 1U) != 0) &&
         (local_1e0 = false, (undefined1 *)local_200._0_8_ != local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"SetCTestConfiguration from CMAKE_TLS_VERSION:TLSVersion:",
                 0x38);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,((cVar6.Value)->_M_dataplus)._M_p,
                          (cVar6.Value)->_M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx"
                   ,0x42,(char *)local_200._0_8_,(this->super_cmCTestHandlerCommand).Quiet);
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"TLSVersion",
                 cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
    }
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_TLS_VERIFY","");
  bVar5 = cmCTest::SetCTestConfigurationFromCMakeVariable
                    (pcVar2,pcVar1,"TLSVerify",(string *)local_1d8,
                     (this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CMAKE_TLS_VERIFY","");
    cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"SetCTestConfiguration from CMAKE_TLS_VERIFY:TLSVerify:",0x36)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,((cVar6.Value)->_M_dataplus)._M_p,
                          (cVar6.Value)->_M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitCommand.cxx"
                   ,0x58,(char *)local_200._0_8_,(this->super_cmCTestHandlerCommand).Quiet);
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"TLSVerify",
                 cVar6.Value,(this->super_cmCTestHandlerCommand).Quiet);
    }
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_CURL_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CurlOptions",(string *)local_1d8,
             (this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d8,"CTEST_SUBMIT_INACTIVITY_TIMEOUT","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"SubmitInactivityTimeout",(string *)local_1d8,
             (this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_NOTES_FILES","");
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    pcVar3 = ((cVar6.Value)->_M_dataplus)._M_p;
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,pcVar3,pcVar3 + (cVar6.Value)->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)local_1d8;
    cmList::cmList((cmList *)local_200,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    cmCTest::GenerateNotesFile
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_200);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_200);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_EXTRA_SUBMIT_FILES","")
  ;
  cVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    pcVar3 = ((cVar6.Value)->_M_dataplus)._M_p;
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,pcVar3,pcVar3 + (cVar6.Value)->_M_string_length);
    init_00._M_len = 1;
    init_00._M_array = (iterator)local_1d8;
    cmList::cmList((cmList *)local_200,init_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    bVar5 = cmCTest::SubmitExtraFiles
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_200);
    if (!bVar5) {
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"problem submitting extra files.","");
      cmCommand::SetError((cmCommand *)this,(string *)local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_200);
      return (cmCTestGenericHandler *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_200);
  }
  this_00 = cmCTest::GetSubmitHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(this_00);
  if ((this->Files).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    local_1c8._8_8_ = local_1d8 + 8;
    local_1d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = 0;
    local_1b0 = 0;
    local_1b8 = (_Base_ptr)local_1c8._8_8_;
    cmCTestSubmitHandler::SelectParts
              (this_00,(set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                        *)local_1d8);
    std::
    _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
    ::~_Rb_tree((_Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                 *)local_1d8);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_1d8,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                &(this->Files).
                 super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_payload._M_value.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(this->Files).
                super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_payload._M_value.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    cmCTestSubmitHandler::SelectFiles
              (this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
  }
  if ((this->Parts).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    name = *(pointer *)
            &(this->Parts).
             super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_payload._M_value.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar4 = (this->Parts).
             super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_payload._M_value.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __position._M_node = (_Base_ptr)(local_1d8 + 8);
    local_1c8._M_allocated_capacity = 0;
    local_1d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1d8._8_8_ = 0;
    local_1b0 = 0;
    local_200._0_8_ = local_1d8;
    local_1c8._8_8_ = __position._M_node;
    local_1b8 = __position._M_node;
    local_58 = this_00;
    if (name != pbVar4) {
      do {
        local_50 = cmCTest::GetPartFromName
                             ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,name);
        std::
        _Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
        ::
        _M_insert_unique_<cmCTest::Part,std::_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>::_Alloc_node>
                  ((_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
                    *)local_1d8,__position,&local_50,(_Alloc_node *)local_200);
        name = name + 1;
      } while (name != pbVar4);
    }
    this_00 = local_58;
    cmCTestSubmitHandler::SelectParts
              (local_58,(set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                         *)local_1d8);
    std::
    _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
    ::~_Rb_tree((_Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                 *)local_1d8);
  }
  if ((this->HttpHeaders).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->HttpHeaders).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmCTestSubmitHandler::SetHttpHeaders
              (this_00,&(this->HttpHeaders).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
  }
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"RetryDelay","");
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_1d8,&this->RetryDelay);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"RetryCount","");
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_1d8,&this->RetryCount);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  local_1d8._0_8_ = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"InternalTest","");
  pcVar8 = "OFF";
  if ((ulong)this->InternalTest != 0) {
    pcVar8 = "ON";
  }
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,pcVar8,pcVar8 + ((ulong)this->InternalTest ^ 3));
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_1d8,(string *)local_200);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  if (this->CDashUpload == true) {
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CDashUploadFile","");
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_1d8,&this->CDashUploadFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CDashUploadType","");
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_1d8,&this->CDashUploadType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestSubmitCommand::InitializeHandler()
{
  cmValue submitURL = !this->SubmitURL.empty()
    ? cmValue(this->SubmitURL)
    : this->Makefile->GetDefinition("CTEST_SUBMIT_URL");

  if (submitURL) {
    this->CTest->SetCTestConfiguration("SubmitURL", *submitURL, this->Quiet);
  } else {
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropMethod", "CTEST_DROP_METHOD", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSiteUser", "CTEST_DROP_SITE_USER", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSitePassword", "CTEST_DROP_SITE_PASSWORD",
      this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSite", "CTEST_DROP_SITE", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropLocation", "CTEST_DROP_LOCATION", this->Quiet);
  }

  if (!this->CTest->SetCTestConfigurationFromCMakeVariable(
        this->Makefile, "TLSVersion", "CTEST_TLS_VERSION", this->Quiet)) {
    if (cmValue tlsVersionVar =
          this->Makefile->GetDefinition("CMAKE_TLS_VERSION")) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "SetCTestConfiguration from CMAKE_TLS_VERSION:TLSVersion:"
          << *tlsVersionVar << std::endl,
        this->Quiet);
      this->CTest->SetCTestConfiguration("TLSVersion", *tlsVersionVar,
                                         this->Quiet);
    } else if (cm::optional<std::string> tlsVersionEnv =
                 cmSystemTools::GetEnvVar("CMAKE_TLS_VERSION")) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "SetCTestConfiguration from ENV{CMAKE_TLS_VERSION}:TLSVersion:"
          << *tlsVersionEnv << std::endl,
        this->Quiet);
      this->CTest->SetCTestConfiguration("TLSVersion", *tlsVersionEnv,
                                         this->Quiet);
    }
  }
  if (!this->CTest->SetCTestConfigurationFromCMakeVariable(
        this->Makefile, "TLSVerify", "CTEST_TLS_VERIFY", this->Quiet)) {
    if (cmValue tlsVerifyVar =
          this->Makefile->GetDefinition("CMAKE_TLS_VERIFY")) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "SetCTestConfiguration from CMAKE_TLS_VERIFY:TLSVerify:"
          << *tlsVerifyVar << std::endl,
        this->Quiet);
      this->CTest->SetCTestConfiguration("TLSVerify", *tlsVerifyVar,
                                         this->Quiet);
    }
  }
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CurlOptions", "CTEST_CURL_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SubmitInactivityTimeout",
    "CTEST_SUBMIT_INACTIVITY_TIMEOUT", this->Quiet);

  cmValue notesFilesVariable =
    this->Makefile->GetDefinition("CTEST_NOTES_FILES");
  if (notesFilesVariable) {
    cmList notesFiles{ *notesFilesVariable };
    this->CTest->GenerateNotesFile(notesFiles);
  }

  cmValue extraFilesVariable =
    this->Makefile->GetDefinition("CTEST_EXTRA_SUBMIT_FILES");
  if (extraFilesVariable) {
    cmList extraFiles{ *extraFilesVariable };
    if (!this->CTest->SubmitExtraFiles(extraFiles)) {
      this->SetError("problem submitting extra files.");
      return nullptr;
    }
  }

  cmCTestSubmitHandler* handler = this->CTest->GetSubmitHandler();
  handler->Initialize();

  // If no FILES or PARTS given, *all* PARTS are submitted by default.
  //
  // If FILES are given, but not PARTS, only the FILES are submitted
  // and *no* PARTS are submitted.
  //  (This is why we select the empty "noParts" set in the
  //   if(this->Files) block below...)
  //
  // If PARTS are given, only the selected PARTS are submitted.
  //
  // If both PARTS and FILES are given, only the selected PARTS *and*
  // all the given FILES are submitted.

  // If given explicit FILES to submit, pass them to the handler.
  //
  if (this->Files) {
    // Intentionally select *no* PARTS. (Pass an empty set.) If PARTS
    // were also explicitly mentioned, they will be selected below...
    // But FILES with no PARTS mentioned should just submit the FILES
    // without any of the default parts.
    //
    handler->SelectParts(std::set<cmCTest::Part>());
    handler->SelectFiles(
      std::set<std::string>(this->Files->begin(), this->Files->end()));
  }

  // If a PARTS option was given, select only the named parts for submission.
  //
  if (this->Parts) {
    auto parts =
      cmMakeRange(*(this->Parts)).transform([this](std::string const& arg) {
        return this->CTest->GetPartFromName(arg);
      });
    handler->SelectParts(std::set<cmCTest::Part>(parts.begin(), parts.end()));
  }

  // Pass along any HTTPHEADER to the handler if this option was given.
  if (!this->HttpHeaders.empty()) {
    handler->SetHttpHeaders(this->HttpHeaders);
  }

  handler->SetOption("RetryDelay", this->RetryDelay);
  handler->SetOption("RetryCount", this->RetryCount);
  handler->SetOption("InternalTest", this->InternalTest ? "ON" : "OFF");

  handler->SetQuiet(this->Quiet);

  if (this->CDashUpload) {
    handler->SetOption("CDashUploadFile", this->CDashUploadFile);
    handler->SetOption("CDashUploadType", this->CDashUploadType);
  }
  return handler;
}